

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

TypeAliasType * slang::ast::TypeAliasType::fromSyntax(Scope *scope,TypedefDeclarationSyntax *syntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceLocation scope_00;
  __extent_storage<18446744073709551615UL> this;
  DeclaredType *this_00;
  DataTypeSyntax *newType;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  string_view sVar1;
  TypeAliasType *result;
  Compilation *comp;
  Token *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  BumpAllocator *in_stack_ffffffffffffffc0;
  Symbol *this_01;
  pointer ppAVar2;
  
  Scope::getCompilation(in_RDI);
  sVar1 = parsing::Token::valueText(in_stack_ffffffffffffffb0);
  this_01 = (Symbol *)sVar1._M_len;
  ppAVar2 = (pointer)sVar1._M_str;
  scope_00 = parsing::Token::location((Token *)&in_RSI[4].parent);
  this._M_extent_value =
       (size_t)BumpAllocator::
               emplace<slang::ast::TypeAliasType,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          (SourceLocation *)in_stack_ffffffffffffffb0);
  this_00 = &((TypeAliasType *)this._M_extent_value)->targetType;
  newType = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                      ((not_null<slang::syntax::DataTypeSyntax_*> *)0x812985);
  DeclaredType::setTypeSyntax(this_00,newType);
  DeclaredType::setDimensionSyntax
            (&((TypeAliasType *)this._M_extent_value)->targetType,
             (SyntaxList<slang::syntax::VariableDimensionSyntax> *)(in_RSI + 5));
  Symbol::setSyntax((Symbol *)this._M_extent_value,in_RSI);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_RDI,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this._M_extent_value);
  syntax_00._M_extent._M_extent_value = this._M_extent_value;
  syntax_00._M_ptr = ppAVar2;
  Symbol::setAttributes(this_01,(Scope *)scope_00,syntax_00);
  return (TypeAliasType *)this._M_extent_value;
}

Assistant:

TypeAliasType& TypeAliasType::fromSyntax(const Scope& scope,
                                         const TypedefDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<TypeAliasType>(syntax.name.valueText(), syntax.name.location());
    result->targetType.setTypeSyntax(*syntax.type);
    result->targetType.setDimensionSyntax(syntax.dimensions);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    return *result;
}